

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_structurizer.cpp
# Opt level: O0

bool __thiscall
dxil_spv::CFGStructurizer::query_reachability_through_back_edges
          (CFGStructurizer *this,CFGNode *from,CFGNode *to)

{
  bool bVar1;
  bool local_31;
  CFGNode *to_local;
  CFGNode *from_local;
  CFGStructurizer *this_local;
  
  bVar1 = CFGNode::dominates(to,from);
  if (bVar1) {
    local_31 = false;
    if (to->pred_back_edge != (CFGNode *)0x0) {
      local_31 = query_reachability(this,from,to->pred_back_edge);
    }
    this_local._7_1_ = local_31;
  }
  else {
    this_local._7_1_ = query_reachability(this,from,to);
  }
  return this_local._7_1_;
}

Assistant:

bool CFGStructurizer::query_reachability_through_back_edges(const CFGNode &from, const CFGNode &to) const
{
	if (to.dominates(&from))
	{
		// If we're dominated by end node, only way we can reach is through a back edge.
		return to.pred_back_edge && query_reachability(from, *to.pred_back_edge);
	}
	else
		return query_reachability(from, to);
}